

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test7(void)

{
  bool bVar1;
  int local_94;
  undefined1 local_90 [4];
  int i;
  vector<int> w2;
  vector<int> v2;
  int local_58 [6];
  undefined1 local_40 [8];
  vector<int> w;
  vector<int> v;
  
  CP::vector<int>::vector((vector<int> *)&w.mSize);
  CP::vector<int>::vector((vector<int> *)local_40);
  local_58[2] = 1;
  CP::vector<int>::push_back((vector<int> *)&w.mSize,local_58 + 2);
  local_58[1] = 2;
  CP::vector<int>::push_back((vector<int> *)&w.mSize,local_58 + 1);
  local_58[0] = 3;
  CP::vector<int>::push_back((vector<int> *)&w.mSize,local_58);
  v2.mSize._4_4_ = 10;
  CP::vector<int>::push_back((vector<int> *)local_40,(int *)((long)&v2.mSize + 4));
  v2.mSize._0_4_ = 4;
  CP::vector<int>::push_back((vector<int> *)local_40,(int *)&v2.mSize);
  CP::vector<int>::vector((vector<int> *)&w2.mSize,(vector<int> *)&w.mSize);
  CP::vector<int>::vector((vector<int> *)local_90,(vector<int> *)local_40);
  for (local_94 = 0; local_94 < 0x186a1; local_94 = local_94 + 1) {
    CP::vector<int>::swap((vector<int> *)&w.mSize,(vector<int> *)local_40);
  }
  bVar1 = CP::vector<int>::operator==((vector<int> *)&w.mSize,(vector<int> *)local_90);
  if ((bVar1) &&
     (bVar1 = CP::vector<int>::operator==((vector<int> *)local_40,(vector<int> *)&w2.mSize), bVar1))
  {
    v.mSize._7_1_ = true;
  }
  else {
    v.mSize._7_1_ = false;
  }
  CP::vector<int>::~vector((vector<int> *)local_90);
  CP::vector<int>::~vector((vector<int> *)&w2.mSize);
  CP::vector<int>::~vector((vector<int> *)local_40);
  CP::vector<int>::~vector((vector<int> *)&w.mSize);
  return v.mSize._7_1_;
}

Assistant:

bool test7() {
  CP::vector<int> v;
  CP::vector<int> w;
  v.push_back(1); v.push_back(2); v.push_back(3);
  w.push_back(10); w.push_back(4);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  for (int i = 0;i < 100001;i++)
    v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}